

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::process_comments(CTcTokenizer *this,size_t start_ofs)

{
  undefined1 *puVar1;
  tok_embed_ctx *this_00;
  tok_embed_level *ptVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  wchar_t wVar6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  char *p;
  ulong uVar10;
  utf8_ptr local_38;
  
  local_38.p_ = (this->linebuf_).buf_ + start_ofs;
  this_00 = &this->comment_in_embedding_;
  bVar4 = false;
  p = local_38.p_;
  do {
    wVar6 = utf8_ptr::s_getch(local_38.p_);
    if (wVar6 == L'\0') {
      pcVar3 = (this->linebuf_).buf_;
      uVar10 = (long)p - (long)pcVar3;
      (this->linebuf_).buf_len_ = uVar10;
      if (uVar10 < (this->linebuf_).buf_size_) {
        pcVar3[uVar10] = '\0';
      }
      if (bVar4) {
        log_warning(0x274b);
      }
      return;
    }
    wVar6 = utf8_ptr::s_getch(local_38.p_);
    if ((this->str_->field_0x28 & 2) == 0) {
      if (this->in_quote_ == L'\0') {
        bVar5 = true;
        if (wVar6 == L'\\') {
LAB_0024bdd2:
          bVar4 = bVar5;
          if ((wVar6 & 0x7ffffffeU) == 0x28 && this_00->level != 0) {
            tok_embed_ctx::parens(this_00,(uint)(wVar6 == L'(') * 2 + -1);
          }
          else if (((this_00->level != 0) && (wVar6 == L'>')) &&
                  (((this->comment_in_embedding_).s)->parens == 0)) {
            wVar6 = utf8_ptr::s_getch_at(local_38.p_,1);
            if (wVar6 == L'>') {
              if (this_00->level == 0) {
                this->in_quote_ = L'\0';
                iVar7 = 0;
              }
              else {
                ptVar2 = (this->comment_in_embedding_).s;
                this->in_quote_ = ptVar2->qu;
                iVar7 = ptVar2->triple;
              }
              this->in_triple_ = iVar7;
              tok_embed_ctx::end_expr(this_00);
              local_38.p_ = utf8_ptr::s_inc(local_38.p_);
              *p = '>';
              p = p + 1;
            }
            wVar6 = L'>';
          }
        }
        else {
          iVar7 = is_space(wVar6);
          if (iVar7 == 0) {
            bVar4 = false;
          }
          if ((wVar6 == L'\"') || (wVar6 == L'\'')) {
            this->in_quote_ = wVar6;
            iVar7 = count_quotes(&local_38,wVar6);
            this->in_triple_ = (uint)(2 < iVar7);
            if (2 < iVar7) {
              utf8_ptr::inc_by(&local_38,2);
              sVar8 = utf8_ptr::s_putch(p,wVar6);
              sVar9 = utf8_ptr::s_putch(p + sVar8,wVar6);
              p = p + sVar8 + sVar9;
            }
          }
          else {
            if (wVar6 == L'/') {
              wVar6 = utf8_ptr::s_getch_at(local_38.p_,1);
              if (wVar6 != L'*') {
                if (wVar6 == L'/') {
                  *p = '\0';
                  return;
                }
                wVar6 = L'/';
                goto LAB_0024c01d;
              }
              puVar1 = &this->str_->field_0x28;
              *puVar1 = *puVar1 | 2;
            }
            else {
              bVar5 = bVar4;
              if (L'\b' < wVar6) goto LAB_0024bdd2;
            }
            wVar6 = L' ';
          }
        }
      }
      else if (wVar6 == L'\\') {
        local_38.p_ = utf8_ptr::s_inc(local_38.p_);
        *p = '\\';
        p = p + 1;
        wVar6 = utf8_ptr::s_getch(local_38.p_);
        if ((this->in_triple_ != 0) && (wVar6 == this->in_quote_)) {
          for (iVar7 = count_quotes(&local_38,wVar6); 1 < iVar7; iVar7 = iVar7 + -1) {
            sVar8 = utf8_ptr::s_putch(p,wVar6);
            p = p + sVar8;
            local_38.p_ = utf8_ptr::s_inc(local_38.p_);
          }
        }
      }
      else if (wVar6 == this->in_quote_) {
        if (this->in_triple_ != 0) {
          iVar7 = count_quotes(&local_38,wVar6);
          if (iVar7 < 3) goto LAB_0024c01d;
          while (iVar7 = iVar7 + -1, iVar7 != 0) {
            sVar8 = utf8_ptr::s_putch(p,wVar6);
            p = p + sVar8;
            local_38.p_ = utf8_ptr::s_inc(local_38.p_);
          }
        }
        this->in_quote_ = L'\0';
      }
      else if (wVar6 == L'<') {
        wVar6 = utf8_ptr::s_getch_at(local_38.p_,1);
        if (wVar6 == L'<') {
          local_38.p_ = utf8_ptr::s_inc(local_38.p_);
          tok_embed_ctx::start_expr(this_00,this->in_quote_,this->in_triple_,0);
          this->in_quote_ = L'\0';
          *p = '<';
          p = p + 1;
        }
        wVar6 = L'<';
      }
LAB_0024c01d:
      sVar8 = utf8_ptr::s_putch(p,wVar6);
      p = p + sVar8;
    }
    else if (wVar6 == L'/') {
      wVar6 = utf8_ptr::s_getch_at(local_38.p_,1);
      if ((wVar6 == L'*') && ((G_prs->field_0xec & 4) == 0)) {
        log_warning(0x274d);
      }
    }
    else if ((wVar6 == L'*') && (wVar6 = utf8_ptr::s_getch_at(local_38.p_,1), wVar6 == L'/')) {
      local_38.p_ = utf8_ptr::s_inc(local_38.p_);
      puVar1 = &this->str_->field_0x28;
      *puVar1 = *puVar1 & 0xfd;
    }
    local_38.p_ = utf8_ptr::s_inc(local_38.p_);
  } while( true );
}

Assistant:

void CTcTokenizer::process_comments(size_t start_ofs)
{
    utf8_ptr src;
    utf8_ptr dst;
    
    /* we haven't found a backslash followed by trailing space yet */
    int trailing_sp_after_bs = FALSE;

    /* 
     *   Scan the line.  When inside a comment, replace each character of
     *   the comment with a space.  When outside comments, simply copy
     *   characters intact.
     *   
     *   Note that we need a separate src and dst pointer, because the
     *   character length of the original and replaced characters may
     *   change.  Fortunately, the length will never do anything but
     *   shrink or stay the same, since the only change we make is to
     *   insert spaces, which are always one byte apiece in UTF-8; we can
     *   therefore update the buffer in place.  
     */
    for (src.set(linebuf_.get_buf() + start_ofs),
         dst.set(linebuf_.get_buf() + start_ofs) ;
         src.getch() != '\0' ; src.inc())
    {
        /* get the current character */
        wchar_t cur = src.getch();

        /* check to see if we're in a comment */
        if (str_->is_in_comment())
        {
            /* 
             *   check to see if the comment is ending, or if we have an
             *   apparent nested comment (which isn't allowed)
             */
            if (cur == '*' && src.getch_at(1) == '/')
            {
                /* 
                 *   skip an extra character of the source - we'll skip
                 *   one in the main loop, so we only need to skip one
                 *   more now 
                 */
                src.inc();
                
                /* we're no longer in a comment */
                str_->set_in_comment(FALSE);
            }
            else if (cur == '/' && src.getch_at(1) == '*')
            {
                /* looks like a nested comment - warn about it */
                if (!G_prs->get_syntax_only())
                    log_warning(TCERR_NESTED_COMMENT);
            }

            /* continue without copying anything from inside the comment */
            continue;
        }
        else if (in_quote_ != '\0')
        {
            /* see what we have */
            if (cur == '\\')
            {
                /* 
                 *   It's a backslash sequence -- copy the backslash to
                 *   the output, and skip it.  Note that we don't have to
                 *   worry about the line ending with a backslash, since
                 *   the line reader will already have considered that to
                 *   be a line splice.  
                 */
                src.inc();
                dst.setch(cur);

                /* get the next character, so we copy it directly */
                cur = src.getch();

                /* 
                 *   if we're in a triple-quoted string, and this is an
                 *   escaped quote, the backslash escapes a whole run of
                 *   consecutive quotes that follow 
                 */
                if (in_triple_ && cur == in_quote_)
                {
                    /* copy and skip any run of quotes, minus the last one */
                    for (int qcnt = count_quotes(&src, cur) ; qcnt > 1 ;
                         dst.setch(cur), src.inc(), --qcnt) ;
                }
            }
            else if (cur == in_quote_)
            {
                /* This is the close quote.  Check for triple quotes. */
                if (in_triple_)
                {
                    /* triple-quoted - we need three quotes in a row */
                    int qcnt = count_quotes(&src, cur);
                    if (qcnt >= 3)
                    {
                        /* copy and skip all but the last in the run */
                        for (int i = 1 ; i < qcnt ; ++i, src.inc())
                            dst.setch(cur);

                        /* close the string */
                        in_quote_ = '\0';
                    }
                }
                else
                {
                    /* regular string, so it ends at the matching quote */
                    in_quote_ = '\0';
                }
            }
            else if (cur == '<' && src.getch_at(1) == '<')
            {
                /* 
                 *   it's an embedded expression starting point - skip the
                 *   first of the '<' characters (the enclosing loop will
                 *   skip the second one)
                 */
                src.inc();

                /* we're in an embedding now */
                comment_in_embedding_.start_expr(in_quote_, in_triple_, FALSE);

                /* the string is done for now */
                in_quote_ = '\0';

                /* copy the extra '<' to the output */
                dst.setch('<');
            }
        }
        else
        {
            /*
             *   Monitor the stream for a backslash followed by trailing
             *   spaces.  If this is a backslash, note that we might have a
             *   backslash with trailing spaces; if it's a space, we might
             *   still have this, so leave the flag alone; if it's anything
             *   else, clear the flag, since we've found something other
             *   than backslashes and spaces.  
             */
            if (cur == '\\')
                trailing_sp_after_bs = TRUE;
            else if (!is_space(cur))
                trailing_sp_after_bs = FALSE;
            
            /* check to see if we're starting a comment */
            if (cur == '/')
            {
                switch(src.getch_at(1))
                {
                case '*':
                    /* note that we're starting a comment */
                    str_->set_in_comment(TRUE);

                    /* 
                     *   replace the starting slash with a space - this
                     *   will effectively replace the entire comment with
                     *   a single space, since we won't copy anything else
                     *   from inside the comment 
                     */
                    cur = ' ';
                    break;

                case '/':
                    /* 
                     *   comment to end of line - we can terminate the
                     *   line at the opening slash and return immediately,
                     *   because the entire rest of the line is to be
                     *   ignored 
                     */
                    dst.setch('\0');
                    return;

                default:
                    /* not a comment - copy it as-is */
                    break;
                }
            }
            else if (cur == '"' || cur == '\'')
            {
                /* it's the start of a new string */
                in_quote_ = cur;

                /* check for triple quotes */
                in_triple_ = (count_quotes(&src, cur) >= 3);

                /* if in triple quotes, copy and skip the extra two qutoes */
                if (in_triple_)
                {
                    src.inc_by(2);
                    dst.setch(cur);
                    dst.setch(cur);
                }
            }
            else if (cur < 0x09)
            {
                /* 
                 *   it's a special flag character - we need to guarantee
                 *   that this character never occurs in input (it
                 *   shouldn't anyway, since it's a control character), so
                 *   translate it to a space 
                 */
                cur = ' ';
            }
            else if (comment_in_embedding_.in_expr()
                     && (cur == '(' || cur == ')'))
            {
                /* adjust the paren level in an embedded expression */
                comment_in_embedding_.parens(cur == '(' ? 1 : -1);
            }
            else if (comment_in_embedding_.in_expr()
                     && comment_in_embedding_.parens() == 0
                     && cur == '>' && src.getch_at(1) == '>')
            {
                /* it's the end of an embedded expression */
                in_quote_ = comment_in_embedding_.qu();
                in_triple_ = comment_in_embedding_.triple();
                comment_in_embedding_.end_expr();

                /* skip the extra '>' and copy it to the output */
                src.inc();
                dst.setch('>');
            }
        }

        /* set the current character in the output */
        dst.setch(cur);
    }

    /* set the updated line buffer length */
    linebuf_.set_text_len(dst.getptr() - linebuf_.get_buf());

    /* 
     *   if we found a backslash with nothing following but whitespace, flag
     *   a warning, since they might have meant the backslash as a line
     *   continuation signal, but we're not interpreting it that way because
     *   of the trailing whitespace 
     */
    if (trailing_sp_after_bs)
        log_warning(TCERR_TRAILING_SP_AFTER_BS);
}